

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

Value * __thiscall FReader::FindKey(FReader *this,char *key)

{
  FJSONObject *pFVar1;
  char *pcVar2;
  uint16_t uVar3;
  uint index;
  Value *pVVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  long lVar6;
  MemberIterator it;
  Ch *local_30;
  ulong local_28;
  char *pcStack_20;
  undefined8 local_18;
  
  pFVar1 = (this->mObjects).Array + ((this->mObjects).Count - 1);
  pGVar5 = pFVar1->mObject;
  uVar3 = (pGVar5->data_).f.flags;
  if (uVar3 == 4) {
    index = pFVar1->mIndex;
    if (index < (pGVar5->data_).s.length) {
      pFVar1->mIndex = index + 1;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](pGVar5,index);
      return pGVar5;
    }
  }
  else if (uVar3 == 3) {
    if (key == (char *)0x0) {
      pVVar4 = this->mKeyValue;
      this->mKeyValue = (Value *)0x0;
      return pVVar4;
    }
    lVar6 = 0;
    do {
      pcVar2 = key + lVar6;
      lVar6 = lVar6 + 1;
    } while (*pcVar2 != '\0');
    local_18 = 0x405000000000000;
    local_28 = (ulong)((int)lVar6 - 1);
    pcStack_20 = key;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_30,pGVar5);
    pVVar4 = pFVar1->mObject;
    if ((pVVar4->data_).f.flags == 3) {
      if (local_30 == (pVVar4->data_).s.str + (ulong)(pVVar4->data_).s.length * 0x30) {
        return (Value *)0x0;
      }
      return (Value *)(local_30 + 0x18);
    }
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/document.h"
                  ,0x43c,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  return (Value *)0x0;
}

Assistant:

rapidjson::Value *FindKey(const char *key)
	{
		FJSONObject &obj = mObjects.Last();
		
		if (obj.mObject->IsObject())
		{
			if (key == nullptr)
			{
				// we are performing an iteration of the object through GetKey.
				auto p = mKeyValue;
				mKeyValue = nullptr;
				return p;
			}
			else
			{
				// Find the given key by name;
				auto it = obj.mObject->FindMember(key);
				if (it == obj.mObject->MemberEnd()) return nullptr;
				return &it->value;
			}
		}
		else if (obj.mObject->IsArray() && (unsigned)obj.mIndex < obj.mObject->Size())
		{
			return &(*obj.mObject)[obj.mIndex++];
		}
		return nullptr;
	}